

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

xmlDocPtr xmlSAXParseMemoryWithData
                    (xmlSAXHandlerPtr sax,char *buffer,int size,int recovery,void *data)

{
  xmlParserCtxtPtr ctxt;
  xmlParserInputPtr input;
  xmlDocPtr pxVar1;
  
  if (size < 0) {
    pxVar1 = (xmlDocPtr)0x0;
  }
  else {
    pxVar1 = (xmlDocPtr)0x0;
    ctxt = xmlNewSAXParserCtxt(sax,(void *)0x0);
    if (ctxt != (xmlParserCtxtPtr)0x0) {
      if (data != (void *)0x0) {
        ctxt->_private = data;
      }
      if (recovery != 0) {
        *(byte *)&ctxt->options = (byte)ctxt->options | 1;
        ctxt->recovery = 1;
      }
      pxVar1 = (xmlDocPtr)0x0;
      input = xmlCtxtNewInputFromMemory
                        (ctxt,(char *)0x0,buffer,(ulong)(uint)size,(char *)0x0,XML_INPUT_BUF_STATIC)
      ;
      if (input != (xmlParserInputPtr)0x0) {
        pxVar1 = xmlCtxtParseDocument(ctxt,input);
      }
      xmlFreeParserCtxt(ctxt);
    }
  }
  return pxVar1;
}

Assistant:

xmlDocPtr
xmlSAXParseMemoryWithData(xmlSAXHandlerPtr sax, const char *buffer,
                          int size, int recovery, void *data) {
    xmlDocPtr ret = NULL;
    xmlParserCtxtPtr ctxt;
    xmlParserInputPtr input;

    if (size < 0)
        return(NULL);

    ctxt = xmlNewSAXParserCtxt(sax, NULL);
    if (ctxt == NULL)
        return(NULL);

    if (data != NULL)
	ctxt->_private=data;

    if (recovery) {
        ctxt->options |= XML_PARSE_RECOVER;
        ctxt->recovery = 1;
    }

    input = xmlCtxtNewInputFromMemory(ctxt, NULL, buffer, size, NULL,
                                      XML_INPUT_BUF_STATIC);

    if (input != NULL)
        ret = xmlCtxtParseDocument(ctxt, input);

    xmlFreeParserCtxt(ctxt);
    return(ret);
}